

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

bool __thiscall QMainWindow::event(QMainWindow *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QMainWindowPrivate *pQVar4;
  QStatusBar *this_00;
  QMainWindowLayout *pQVar5;
  QMainWindowLayout *pQVar6;
  uint *__addr_len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar7;
  QEvent *in_RSI;
  QEvent *pQVar8;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QPoint *in_stack_00000028;
  QLayoutItem *in_stack_00000030;
  QMainWindowLayout *in_stack_00000038;
  QDragMoveEvent *dragMoveEvent;
  QStatusBar *sb;
  QMainWindowPrivate *d;
  QEvent *in_stack_00000078;
  QWidget *in_stack_00000080;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QMainWindowLayout *in_stack_ffffffffffffff30;
  QPointF *in_stack_ffffffffffffff38;
  QWidget *this_01;
  QSize *in_stack_ffffffffffffff40;
  QMainWindow *in_stack_ffffffffffffff48;
  int timeout;
  QString *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *in_stack_ffffffffffffff98;
  
  timeout = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = in_RSI;
  pQVar4 = d_func((QMainWindow *)0x5eabd5);
  iVar7 = (int)pQVar8;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMainWindowLayout> *)0x5eabeb);
  if (bVar2) {
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eac02);
    iVar7 = (int)in_RSI;
    bVar2 = QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::windowEvent
                      (in_stack_ffffffffffffff98,
                       (QEvent *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    if (bVar2) {
      bVar2 = true;
      goto LAB_005eaf1b;
    }
  }
  TVar3 = QEvent::type(in_RSI);
  __addr_len = &switchD_005eac53::switchdataD_00b1c7a0;
  switch(TVar3) {
  case DragEnter:
  case Drop:
    pQVar5 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ead5c);
    if (pQVar5->draggingWidget != (QLayoutItem *)0x0) {
      QEvent::accept(in_RSI,iVar7,__addr,__addr_len);
      bVar2 = true;
      goto LAB_005eaf1b;
    }
    break;
  case DragMove:
    pQVar5 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ead90);
    if (pQVar5->draggingWidget != (QLayoutItem *)0x0) {
      pQVar5 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eadba);
      pQVar6 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eadd0);
      iVar7 = (int)pQVar6->draggingWidget;
      QDropEvent::position((QDropEvent *)in_stack_ffffffffffffff38);
      QWidget::mapToGlobal((QWidget *)pQVar5,in_stack_ffffffffffffff38);
      QPointF::toPoint((QPointF *)pQVar5);
      QMainWindowLayout::hover(in_stack_00000038,in_stack_00000030,in_stack_00000028);
      QEvent::accept(in_RSI,iVar7,__addr_00,__addr_len);
      bVar2 = true;
      goto LAB_005eaf1b;
    }
    break;
  case DragLeave:
    pQVar5 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eae6d);
    if (pQVar5->draggingWidget != (QLayoutItem *)0x0) {
      pQVar5 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eae8d);
      pQVar6 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eaea3);
      this_01 = (QWidget *)pQVar6->draggingWidget;
      QWidget::pos(this_01);
      QPoint::QPoint((QPoint *)pQVar5,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      ::operator-((QPoint *)in_stack_ffffffffffffff40,(QPoint *)this_01);
      QMainWindowLayout::hover(in_stack_00000038,in_stack_00000030,in_stack_00000028);
      bVar2 = true;
      goto LAB_005eaf1b;
    }
    break;
  default:
    break;
  case StyleChange:
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ead03);
    QDockAreaLayout::styleChangedEvent((QDockAreaLayout *)in_stack_ffffffffffffff30);
    if ((pQVar4->explicitIconSize & 1U) == 0) {
      QSize::QSize((QSize *)in_stack_ffffffffffffff30);
      setIconSize(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    break;
  case StatusTip:
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eac8a);
    this_00 = QMainWindowLayout::statusBar(in_stack_ffffffffffffff30);
    if (this_00 == (QStatusBar *)0x0) {
      QEvent::ignore(in_RSI);
    }
    else {
      QStatusTipEvent::tip
                ((QStatusTipEvent *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      QStatusBar::showMessage(this_00,in_stack_ffffffffffffff68,timeout);
      QString::~QString((QString *)0x5eacdc);
    }
    bVar2 = true;
    goto LAB_005eaf1b;
  case ToolBarChange:
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eac67);
    QMainWindowLayout::toggleToolBarsVisible(in_stack_ffffffffffffff30);
    bVar2 = true;
    goto LAB_005eaf1b;
  }
  bVar2 = QWidget::event(in_stack_00000080,in_stack_00000078);
LAB_005eaf1b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::event(QEvent *event)
{
    Q_D(QMainWindow);

#if QT_CONFIG(dockwidget)
    if (d->layout && d->layout->windowEvent(event))
        return true;
#endif

    switch (event->type()) {

#if QT_CONFIG(toolbar)
        case QEvent::ToolBarChange: {
            Q_ASSERT(d->layout);
            d->layout->toggleToolBarsVisible();
            return true;
        }
#endif

#if QT_CONFIG(statustip)
        case QEvent::StatusTip:
#if QT_CONFIG(statusbar)
            Q_ASSERT(d->layout);
            if (QStatusBar *sb = d->layout->statusBar())
                sb->showMessage(static_cast<QStatusTipEvent*>(event)->tip());
            else
#endif
                static_cast<QStatusTipEvent*>(event)->ignore();
            return true;
#endif // QT_CONFIG(statustip)

        case QEvent::StyleChange:
#if QT_CONFIG(dockwidget)
            Q_ASSERT(d->layout);
            d->layout->layoutState.dockAreaLayout.styleChangedEvent();
#endif
            if (!d->explicitIconSize)
                setIconSize(QSize());
            break;
#if QT_CONFIG(draganddrop)
        case QEvent::DragEnter:
        case QEvent::Drop:
            if (!d->layout->draggingWidget)
                break;
            event->accept();
            return true;
        case QEvent::DragMove: {
            if (!d->layout->draggingWidget)
                break;
            auto dragMoveEvent = static_cast<QDragMoveEvent *>(event);
            d->layout->hover(d->layout->draggingWidget,
                             mapToGlobal(dragMoveEvent->position()).toPoint());
            event->accept();
            return true;
        }
        case QEvent::DragLeave:
            if (!d->layout->draggingWidget)
                break;
            d->layout->hover(d->layout->draggingWidget, pos() - QPoint(-1, -1));
            return true;
#endif
        default:
            break;
    }

    return QWidget::event(event);
}